

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-link.h
# Opt level: O2

void __thiscall mp::pre::Many2ManyLink::AddEntry(Many2ManyLink *this,LinkEntry be)

{
  _Elt_pointer ppVar1;
  bool bVar2;
  _Elt_pointer ppVar3;
  _Elt_pointer ppVar4;
  size_type sVar5;
  
  ppVar4 = (this->entries_).
           super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar4 != (this->entries_).
                super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppVar4 == (this->entries_).
                  super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar4 = (this->entries_).
               super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    bVar2 = NodeRange::operator==(&ppVar4[-1].first,&be.first);
    ppVar4 = (this->entries_).
             super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar1 = (this->entries_).
             super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    if (bVar2) {
      ppVar3 = ppVar4;
      if (ppVar4 == ppVar1) {
        ppVar3 = (this->entries_).
                 super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      if ((ppVar3[-1].second.pvn_ == be.second.pvn_) &&
         (ppVar3[-1].second.ir_.end_ == be.second.ir_.beg_)) {
        ppVar3[-1].second.ir_.end_ = be.second.ir_.end_;
        return;
      }
    }
    if (ppVar4 == ppVar1) {
      ppVar4 = (this->entries_).
               super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    bVar2 = NodeRange::operator==(&ppVar4[-1].second,&be.second);
    if (bVar2) {
      ppVar4 = (this->entries_).
               super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVar4 == (this->entries_).
                    super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar4 = (this->entries_).
                 super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      if ((ppVar4[-1].first.pvn_ == be.first.pvn_) &&
         (ppVar4[-1].first.ir_.end_ == be.first.ir_.beg_)) {
        ppVar4[-1].first.ir_.end_ = be.first.ir_.end_;
        return;
      }
    }
  }
  std::
  deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
  ::push_back(&this->entries_,&be);
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->if_consider_for_last_link_,false);
  sVar5 = std::
          deque<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
          ::size(&this->entries_);
  BasicLink::RegisterLinkIndex(&this->super_BasicLink,(int)sVar5 + -1);
  return;
}

Assistant:

void AddEntry(LinkEntry be) {
    if (entries_.empty() ||
        !(
          (entries_.back().first==be.first   // same sources
           && entries_.back().second.TryExtendBy(be.second))
          ||
          (entries_.back().second==be.second // same targets
           && entries_.back().first.TryExtendBy(be.first))
          )) {
      entries_.push_back(be);             // Add new entry
      if_consider_for_last_link_.push_back(false);
      RegisterLinkIndex(entries_.size()-1);
    }
  }